

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_backend_test.cpp
# Opt level: O0

void test_two_clients(intrusive_ptr<cppcms::impl::base_cache> *c1,
                     intrusive_ptr<cppcms::impl::base_cache> *c2)

{
  bool bVar1;
  base_cache *pbVar2;
  time_t tVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  intrusive_ptr<cppcms::impl::base_cache> *in_RSI;
  intrusive_ptr<cppcms::impl::base_cache> *in_RDI;
  ostringstream oss_5;
  ostringstream oss_4;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  string tmp;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff1f8;
  string *in_stack_fffffffffffff200;
  string *in_stack_fffffffffffff208;
  base_cache *in_stack_fffffffffffff210;
  bool local_d92;
  bool local_ce2;
  string local_c08 [32];
  ostringstream local_be8 [383];
  allocator local_a69;
  string local_a68 [39];
  undefined1 local_a41;
  string local_a40 [32];
  ostringstream local_a20 [383];
  allocator local_8a1;
  string local_8a0 [39];
  allocator local_879;
  string local_878 [39];
  allocator local_851;
  string local_850 [39];
  undefined1 local_829;
  string local_828 [32];
  ostringstream local_808 [383];
  allocator local_689;
  string local_688 [39];
  allocator local_661;
  string local_660 [39];
  undefined1 local_639;
  string local_638 [32];
  ostringstream local_618 [383];
  allocator local_499;
  string local_498 [39];
  allocator local_471;
  string local_470 [39];
  allocator local_449;
  string local_448 [39];
  undefined1 local_421;
  string local_420 [32];
  ostringstream local_400 [383];
  undefined1 local_281;
  string local_280 [32];
  ostringstream local_260 [383];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [48];
  undefined1 local_60 [48];
  string local_30 [48];
  
  std::__cxx11::string::string(local_30);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x10e151);
  pbVar2 = booster::intrusive_ptr<cppcms::impl::base_cache>::operator->(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"foo",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"test",&local_b9);
  tVar3 = time((time_t *)0x0);
  (**(code **)(*(long *)pbVar2 + 8))(pbVar2,local_90,local_b8,local_60,tVar3 + 1,0);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  booster::intrusive_ptr<cppcms::impl::base_cache>::operator->(in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"foo",&local_e1);
  bVar1 = cppcms::impl::base_cache::fetch
                    (in_stack_fffffffffffff210,in_stack_fffffffffffff208,in_stack_fffffffffffff200,
                     in_stack_fffffffffffff1f8);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_260);
    poVar4 = std::operator<<((ostream *)local_260,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_backend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,99);
    std::operator<<(poVar4," c2->fetch(\"foo\",tmp,0)");
    local_281 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_280);
    local_281 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::operator==(in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_400);
    poVar4 = std::operator<<((ostream *)local_400,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_backend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,100);
    std::operator<<(poVar4," tmp==\"test\"");
    local_421 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_420);
    local_421 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pbVar2 = booster::intrusive_ptr<cppcms::impl::base_cache>::operator->(in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"foo",&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_470,"test2",&local_471);
  tVar3 = time((time_t *)0x0);
  (**(code **)(*(long *)pbVar2 + 8))(pbVar2,local_448,local_470,local_60,tVar3 + 1,0);
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  booster::intrusive_ptr<cppcms::impl::base_cache>::operator->(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_498,"foo",&local_499);
  bVar1 = cppcms::impl::base_cache::fetch
                    (in_stack_fffffffffffff210,in_stack_fffffffffffff208,in_stack_fffffffffffff200,
                     in_stack_fffffffffffff1f8);
  local_ce2 = false;
  if (bVar1) {
    local_ce2 = std::operator==(in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8);
  }
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  if (local_ce2 == false) {
    std::__cxx11::ostringstream::ostringstream(local_618);
    poVar4 = std::operator<<((ostream *)local_618,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_backend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x66);
    std::operator<<(poVar4," c1->fetch(\"foo\",tmp,0) && tmp==\"test2\"");
    local_639 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_638);
    local_639 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pbVar2 = booster::intrusive_ptr<cppcms::impl::base_cache>::operator->(in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_660,"foo",&local_661);
  (**(code **)(*(long *)pbVar2 + 0x10))(pbVar2,local_660);
  std::__cxx11::string::~string(local_660);
  std::allocator<char>::~allocator((allocator<char> *)&local_661);
  booster::intrusive_ptr<cppcms::impl::base_cache>::operator->(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_688,"foo",&local_689);
  bVar1 = cppcms::impl::base_cache::fetch
                    (in_stack_fffffffffffff210,in_stack_fffffffffffff208,in_stack_fffffffffffff200,
                     in_stack_fffffffffffff1f8);
  std::__cxx11::string::~string(local_688);
  std::allocator<char>::~allocator((allocator<char> *)&local_689);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_808);
    poVar4 = std::operator<<((ostream *)local_808,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_backend_test.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x68);
    std::operator<<(poVar4," c1->fetch(\"foo\",tmp,0)==false");
    local_829 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_828);
    local_829 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pbVar2 = booster::intrusive_ptr<cppcms::impl::base_cache>::operator->(in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_850,"foo",&local_851);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_878,"test3",&local_879);
  tVar3 = time((time_t *)0x0);
  (**(code **)(*(long *)pbVar2 + 8))(pbVar2,local_850,local_878,local_60,tVar3 + 1,0);
  std::__cxx11::string::~string(local_878);
  std::allocator<char>::~allocator((allocator<char> *)&local_879);
  std::__cxx11::string::~string(local_850);
  std::allocator<char>::~allocator((allocator<char> *)&local_851);
  booster::intrusive_ptr<cppcms::impl::base_cache>::operator->(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8a0,"foo",&local_8a1);
  bVar1 = cppcms::impl::base_cache::fetch
                    (in_stack_fffffffffffff210,in_stack_fffffffffffff208,in_stack_fffffffffffff200,
                     in_stack_fffffffffffff1f8);
  local_d92 = false;
  if (bVar1) {
    local_d92 = std::operator==(in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8);
  }
  std::__cxx11::string::~string(local_8a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a1);
  if (local_d92 != false) {
    pbVar2 = booster::intrusive_ptr<cppcms::impl::base_cache>::operator->(in_RSI);
    (**(code **)(*(long *)pbVar2 + 0x20))();
    booster::intrusive_ptr<cppcms::impl::base_cache>::operator->(in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a68,"foo",&local_a69);
    bVar1 = cppcms::impl::base_cache::fetch
                      (in_stack_fffffffffffff210,in_stack_fffffffffffff208,in_stack_fffffffffffff200
                       ,in_stack_fffffffffffff1f8);
    std::__cxx11::string::~string(local_a68);
    std::allocator<char>::~allocator((allocator<char> *)&local_a69);
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_be8);
      poVar4 = std::operator<<((ostream *)local_be8,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_backend_test.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x6c);
      std::operator<<(poVar4," c1->fetch(\"foo\",tmp,0)==false");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_c08);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x10f4ea);
    std::__cxx11::string::~string(local_30);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_a20);
  poVar4 = std::operator<<((ostream *)local_a20,"Error ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_backend_test.cpp"
                          );
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x6a);
  std::operator<<(poVar4," c1->fetch(\"foo\",tmp,0) && tmp==\"test3\"");
  local_a41 = 1;
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar5,local_a40);
  local_a41 = 0;
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_two_clients(booster::intrusive_ptr<cppcms::impl::base_cache> c1,booster::intrusive_ptr<cppcms::impl::base_cache> c2)
{
	std::string tmp;
	std::set<std::string> tags;
	c1->store("foo","test",tags,time(0)+1);
	TEST(c2->fetch("foo",tmp,0));
	TEST(tmp=="test");
	c2->store("foo","test2",tags,time(0)+1);
	TEST(c1->fetch("foo",tmp,0) && tmp=="test2");
	c2->rise("foo");
	TEST(c1->fetch("foo",tmp,0)==false);
	c2->store("foo","test3",tags,time(0)+1);
	TEST(c1->fetch("foo",tmp,0) && tmp=="test3");
	c2->clear();
	TEST(c1->fetch("foo",tmp,0)==false);
}